

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

BeagleResourceList * beagleGetResourceList(void)

{
  int *piVar1;
  ulong *puVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  bool bVar5;
  BeagleResourceList *pBVar6;
  long lVar7;
  BeagleResource *pBVar8;
  list<BeagleResource,_std::allocator<BeagleResource>_> *__x;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  _List_node_base *p_Var13;
  pair<int,_int> local_58;
  _List_node_base *local_50;
  list<BeagleResource,_std::allocator<BeagleResource>_> rList;
  
  if (plugins_abi_cxx11_ ==
      (list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)0x0) {
    beagleLoadPlugins();
  }
  if (rsrcList == (BeagleResourceList *)0x0) {
    pBVar6 = (BeagleResourceList *)malloc(0x10);
    rsrcList = pBVar6;
    pBVar6->length = 0;
    iVar9 = 0;
    p_Var13 = (_List_node_base *)plugins_abi_cxx11_;
    while (p_Var13 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                        *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var13 != (_List_node_base *)plugins_abi_cxx11_) {
      lVar7 = (**(code **)(*(long *)p_Var13[1]._M_next + 0x18))();
      pBVar6 = rsrcList;
      iVar9 = rsrcList->length + *(int *)(lVar7 + 0x10);
      rsrcList->length = iVar9;
    }
    pBVar8 = (BeagleResource *)malloc((long)iVar9 << 5);
    pBVar6->list = pBVar8;
    local_50 = (_List_node_base *)plugins_abi_cxx11_;
    uVar12 = 0;
    while (local_50 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                         *)&local_50->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          local_50 != (_List_node_base *)plugins_abi_cxx11_) {
      __x = (list<BeagleResource,_std::allocator<BeagleResource>_> *)
            (**(code **)(*(long *)local_50[1]._M_next + 0x18))();
      p_Var13 = (_List_node_base *)&rList;
      std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::list
                ((list<BeagleResource,_std::allocator<BeagleResource>_> *)p_Var13,__x);
      uVar11 = uVar12;
      while (pBVar6 = rsrcList,
            p_Var13 = (((_List_base<BeagleResource,_std::allocator<BeagleResource>_> *)
                       &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var13 != (_List_node_base *)&rList) {
        bVar5 = false;
        for (lVar7 = 0; (ulong)(~((int)uVar12 >> 0x1f) & uVar12) << 5 != lVar7; lVar7 = lVar7 + 0x20
            ) {
          pBVar8 = pBVar6->list;
          iVar9 = strcmp(*(char **)((long)&pBVar8->name + lVar7),(char *)p_Var13[1]._M_next);
          if (iVar9 == 0) {
            if (!bVar5) {
              piVar1 = &pBVar6->length;
              *piVar1 = *piVar1 + -1;
              bVar5 = true;
            }
            puVar2 = (ulong *)((long)&pBVar8->supportFlags + lVar7);
            *puVar2 = *puVar2 | (ulong)p_Var13[2]._M_next;
          }
        }
        if (!bVar5) {
          local_58.second = uVar11 - uVar12;
          local_58.first = uVar11;
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<std::pair<int,int>>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&ResourceMap,&local_58);
          p_Var3 = p_Var13[1]._M_prev;
          lVar7 = (long)p_Var13[2]._M_next;
          p_Var4 = p_Var13[2]._M_prev;
          lVar10 = (long)(int)uVar11;
          uVar11 = uVar11 + 1;
          pBVar8 = rsrcList->list + lVar10;
          pBVar8->name = (char *)p_Var13[1]._M_next;
          pBVar8->description = (char *)p_Var3;
          pBVar8->supportFlags = lVar7;
          pBVar8->requiredFlags = (long)p_Var4;
        }
      }
      std::__cxx11::_List_base<BeagleResource,_std::allocator<BeagleResource>_>::_M_clear
                (&rList.super__List_base<BeagleResource,_std::allocator<BeagleResource>_>);
      uVar12 = uVar11;
    }
  }
  return rsrcList;
}

Assistant:

BeagleResourceList* beagleGetResourceList() {
    // plugins must be loaded before resources
    if (plugins==NULL)
        beagleLoadPlugins();

    if (rsrcList == NULL) {
        // count the total resources across plugins
        rsrcList = (BeagleResourceList*) malloc(sizeof(BeagleResourceList));
        rsrcList->length = 0;
        std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins->begin();
        for(; plugin_iter != plugins->end(); plugin_iter++ ){
            rsrcList->length += (*plugin_iter)->getBeagleResources().size();
        }

        // allocate space for a complete list of resources
        rsrcList->list = (BeagleResource*) malloc(sizeof(BeagleResource) * rsrcList->length);

        // copy in resource lists from each plugin
        int rI=0;
        for(plugin_iter = plugins->begin(); plugin_iter != plugins->end(); plugin_iter++ ){
            std::list<BeagleResource> rList = (*plugin_iter)->getBeagleResources();
            std::list<BeagleResource>::iterator r_iter = rList.begin();
            int prev_rI = rI;
            for(; r_iter != rList.end(); r_iter++){
                bool rsrcExists = false;
                for(int i=0; i<prev_rI; i++){
                    if (strcmp(rsrcList->list[i].name, r_iter->name) == 0) {
                        if (!rsrcExists) {
                            rsrcExists = true;
                            rsrcList->length--;
                        }
                        rsrcList->list[i].supportFlags |= r_iter->supportFlags;
                    }
                }

                if (!rsrcExists) {
                    ResourceMap.insert(std::pair<int, int>(rI, (rI - prev_rI)));
                    rsrcList->list[rI++] = *r_iter;
                }
            }
        }
    }
    return rsrcList;
}